

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall tonk::gateway::StateMachine::OnTick(StateMachine *this)

{
  undefined8 *puVar1;
  pointer pGVar2;
  HTTPRequester *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar3;
  uint64_t nowUsec;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  API_CopyRequests(this);
  SSDPRequester::OnTick(this->SSDP);
  if ((this->GatewayEndpoints).
      super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->GatewayEndpoints).
      super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    nowUsec = siamese::GetTimeUsec();
    uVar4 = (int)((long)(this->GatewayEndpoints).
                        super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->GatewayEndpoints).
                        super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3d70a3d7;
    if (0 < (int)uVar4) {
      lVar5 = 0xb8;
      uVar6 = 0;
      do {
        pGVar2 = (this->GatewayEndpoints).
                 super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = *(HTTPRequester **)((long)pGVar2 + lVar5 + -8);
        if (this_00 == (HTTPRequester *)0x0) {
LAB_00138ec1:
          if (0 < *(int *)((long)pGVar2 + lVar5 + -0x10)) {
            BeginGatewayXMLRequest(this,(int)uVar6);
          }
        }
        else {
          bVar3 = HTTPRequester::OnTick_IsDisposable(this_00,nowUsec);
          if (bVar3) {
            this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)&(pGVar2->URL).FullURL._M_dataplus + lVar5);
            puVar1 = (undefined8 *)((long)pGVar2 + lVar5 + -8);
            *puVar1 = 0;
            puVar1[1] = 0;
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
            goto LAB_00138ec1;
          }
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 200;
      } while ((uVar4 & 0x7fffffff) != uVar6);
    }
    uVar4 = (int)((long)(this->ControlEndpoints).
                        super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->ControlEndpoints).
                        super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x6eb3e453;
    if (0 < (int)uVar4) {
      lVar5 = 0x120;
      uVar6 = 0;
      do {
        if (*(char *)((long)&(((this->ControlEndpoints).
                               super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                               ._M_impl.super__Vector_impl_data._M_start)->URL).FullURL._M_dataplus
                     + lVar5) == '\x01') {
          BeginControlSOAPRequests(this,(int)uVar6);
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x128;
      } while ((uVar4 & 0x7fffffff) != uVar6);
    }
  }
  return;
}

Assistant:

void StateMachine::OnTick()
{
    API_CopyRequests();

    SSDP->OnTick();

    if (GatewayEndpoints.empty()) {
        return;
    }

    const uint64_t nowUsec = siamese::GetTimeUsec();

    const int gatewayCount = (int)GatewayEndpoints.size();
    for (int gatewayIndex = 0; gatewayIndex < gatewayCount; ++gatewayIndex)
    {
        auto& gateway = GatewayEndpoints[gatewayIndex];

        // If request is in progress:
        if (gateway.Requester)
        {
            // If the requester is dead:
            if (gateway.Requester->OnTick_IsDisposable(nowUsec)) {
                // Free it so we can try again
                gateway.Requester = nullptr;
            }
            else {
                continue;
            }
        }

        // If there are no more retries:
        if (gateway.RetriesRemaining <= 0) {
            continue; // Do not retry
        }

        BeginGatewayXMLRequest(gatewayIndex);
    }

    // Begin control SOAP requests for each endpoint
    const int controlCount = (int)ControlEndpoints.size();
    for (int controlIndex = 0; controlIndex < controlCount; ++controlIndex)
    {
        ControlEndpoint& control = ControlEndpoints[controlIndex];

        // If endpoint is not active:
        if (!control.EndpointActive) {
            continue;
        }

        BeginControlSOAPRequests(controlIndex);
    }
}